

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

QRect __thiscall
QTableViewPrivate::intersectedRect
          (QTableViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  minMaxPair mVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  QRect QVar5;
  QRect local_70;
  QRect local_60;
  anon_class_8_1_54a39811 local_50;
  QRect local_48;
  long local_38;
  
  local_48._8_8_ = rect._8_8_;
  local_48._0_8_ = rect._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.q = *(QTableView **)
                &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  mVar1 = intersectedRect::anon_class_8_1_54a39811::operator()
                    (&local_50,this->verticalHeader,topLeft->r,bottomRight->r,
                     (minMaxPair)
                     (local_48._8_8_ & 0xffffffff00000000 | (ulong)local_48._0_8_ >> 0x20));
  iVar2 = mVar1.first;
  iVar3 = mVar1.second;
  if (iVar2 == iVar3) {
    QVar5 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    local_60.x1 = rect.x1.m_i;
    local_60.x2 = rect.x2.m_i;
    local_60.y1.m_i = iVar2;
    local_60.y2.m_i = iVar3;
    auVar4 = QRect::operator&(&local_48,&local_60);
    if ((auVar4._0_4_ + -1 == auVar4._8_4_) && (auVar4._4_4_ + -1 == auVar4._12_4_)) {
      QVar5 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    }
    else {
      mVar1.second = local_48.x2.m_i;
      mVar1.first = local_48.x1.m_i;
      mVar1 = intersectedRect::anon_class_8_1_54a39811::operator()
                        (&local_50,this->horizontalHeader,topLeft->c,bottomRight->c,mVar1);
      local_70.x1.m_i = mVar1.first;
      local_70.x2.m_i = mVar1.second;
      local_70.y1.m_i = iVar2;
      local_70.y2.m_i = iVar3;
      QVar5 = (QRect)QRect::operator&(&local_48,&local_70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTableViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    Q_Q(const QTableView);

    using minMaxPair = std::pair<int, int>;
    const auto calcMinMax = [q](QHeaderView *hdr, int startIdx, int endIdx, minMaxPair bounds) -> minMaxPair
    {
        minMaxPair ret(std::numeric_limits<int>::max(), std::numeric_limits<int>::min());
        if (hdr->sectionsMoved()) {
            for (int i = startIdx; i <= endIdx; ++i) {
                const int start = hdr->sectionViewportPosition(i);
                const int end = start + hdr->sectionSize(i);
                ret.first = std::min(start, ret.first);
                ret.second = std::max(end, ret.second);
                if (ret.first <= bounds.first && ret.second >= bounds.second)
                    break;
            }
        } else {
            if (q->isRightToLeft() && q->horizontalHeader() == hdr)
                std::swap(startIdx, endIdx);
            ret.first = hdr->sectionViewportPosition(startIdx);
            ret.second = hdr->sectionViewportPosition(endIdx) +
                         hdr->sectionSize(endIdx);
        }
        return ret;
    };

    const auto yVals = calcMinMax(verticalHeader, topLeft.row(), bottomRight.row(),
                                  minMaxPair(rect.top(), rect.bottom()));
    if (yVals.first == yVals.second) // all affected rows are hidden
        return QRect();

    // short circuit: check if no row is inside rect
    const QRect colRect(QPoint(rect.left(), yVals.first),
                        QPoint(rect.right(), yVals.second));
    const QRect intersected = rect.intersected(colRect);
    if (intersected.isNull())
        return QRect();

    const auto xVals = calcMinMax(horizontalHeader, topLeft.column(), bottomRight.column(),
                                  minMaxPair(rect.left(), rect.right()));
    const QRect updateRect(QPoint(xVals.first, yVals.first),
                           QPoint(xVals.second, yVals.second));
    return rect.intersected(updateRect);
}